

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3AllocateMSI(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  int iVar2;
  u32 *puVar3;
  
  if (pExpr->aMI == (u32 *)0x0) {
    iVar1 = *(int *)((long)pCtx + 0x30);
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      puVar3 = (u32 *)sqlite3Malloc((long)iVar1 * 0xc);
    }
    else {
      puVar3 = (u32 *)0x0;
    }
    pExpr->aMI = puVar3;
    if (puVar3 == (u32 *)0x0) {
      return 7;
    }
  }
  memset(pExpr->aMI,0,(long)*(int *)((long)pCtx + 0x30) * 0xc);
  return 0;
}

Assistant:

static int fts3AllocateMSI(Fts3Expr *pExpr, int iPhrase, void *pCtx){
  Fts3Table *pTab = (Fts3Table*)pCtx;
  UNUSED_PARAMETER(iPhrase);
  if( pExpr->aMI==0 ){
    pExpr->aMI = (u32 *)sqlite3_malloc64(pTab->nColumn * 3 * sizeof(u32));
    if( pExpr->aMI==0 ) return SQLITE_NOMEM;
  }
  memset(pExpr->aMI, 0, pTab->nColumn * 3 * sizeof(u32));
  return SQLITE_OK;
}